

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O0

void mf_train<sparse_parameters>(gdmf *d,example *ec,sparse_parameters *weights)

{
  bool bVar1;
  size_t sVar2;
  float *pfVar3;
  undefined8 uVar4;
  undefined8 in_RDX;
  long in_RSI;
  long *in_RDI;
  float fVar5;
  stringstream __msg;
  float l_dot_x;
  size_t k_1;
  float r_dot_x;
  size_t k;
  string *i;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  features *fs;
  iterator __end1;
  iterator __begin1;
  example *__range1;
  float regularization;
  float update;
  float eta_t;
  label_data *ld;
  vw *all;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd48;
  example_predict *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  int plineNumber;
  char *in_stack_fffffffffffffd78;
  vw_exception *in_stack_fffffffffffffd80;
  float fVar6;
  undefined4 in_stack_fffffffffffffd8c;
  sparse_parameters *in_stack_fffffffffffffd90;
  stringstream local_240 [16];
  ostream local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  float local_a4;
  ulong local_a0;
  float local_94;
  ulong local_90;
  reference local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  long *local_70;
  features *local_68;
  iterator local_60;
  iterator local_50;
  long local_40;
  float local_34;
  undefined4 local_30;
  float local_2c;
  undefined4 *local_28;
  long *local_20;
  undefined8 local_18;
  long local_10;
  long *local_8;
  
  local_20 = (long *)*in_RDI;
  local_28 = (undefined4 *)(in_RSI + 0x6828);
  fVar6 = *(float *)(local_20 + 0x6ac);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fVar5 = powf((float)*(double *)(*local_20 + 0x18) + *(float *)(in_RSI + 0x6870),
               *(float *)((long)local_20 + 0x334));
  local_2c = ((fVar6 / fVar5) / 3.0) * *(float *)(local_10 + 0x6870);
  local_30 = (**(code **)(*(long *)local_20[0x6a9] + 0x10))
                       (*(undefined4 *)(local_10 + 0x6850),*local_28,local_2c,0x3f800000);
  local_34 = local_2c * *(float *)((long)local_20 + 0x32c);
  local_40 = local_10;
  local_50 = example_predict::begin(in_stack_fffffffffffffd50);
  local_60 = example_predict::end(in_stack_fffffffffffffd50);
  while (bVar1 = example_predict::iterator::operator!=(&local_50,&local_60), bVar1) {
    local_68 = example_predict::iterator::operator*(&local_50);
    sd_offset_update<sparse_parameters>
              (in_stack_fffffffffffffd90,(features *)CONCAT44(in_stack_fffffffffffffd8c,fVar6),
               (uint64_t)in_stack_fffffffffffffd80,(float)((ulong)in_stack_fffffffffffffd78 >> 0x20)
               ,SUB84(in_stack_fffffffffffffd78,0));
    example_predict::iterator::operator++(&local_50);
  }
  local_70 = local_20 + 0x70;
  local_78._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffd48);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_fffffffffffffd48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffd50,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffd48);
    plineNumber = (int)((ulong)in_stack_fffffffffffffd70 >> 0x20);
    if (!bVar1) break;
    local_88 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_78);
    in_stack_fffffffffffffd80 = (vw_exception *)(local_10 + 0x20);
    std::__cxx11::string::operator[]((ulong)local_88);
    sVar2 = features::size((features *)0x23a3e5);
    if (sVar2 != 0) {
      in_stack_fffffffffffffd78 = (char *)(local_10 + 0x20);
      std::__cxx11::string::operator[]((ulong)local_88);
      sVar2 = features::size((features *)0x23a428);
      if (sVar2 != 0) {
        for (local_90 = 1; local_90 <= *(uint *)(local_8 + 5); local_90 = local_90 + 1) {
          pfVar3 = v_array<float>::operator[]((v_array<float> *)(local_8 + 1),local_90 << 1);
          local_94 = *pfVar3;
          in_stack_fffffffffffffd68 = (string *)(local_10 + 0x20);
          in_stack_fffffffffffffd70 = local_18;
          std::__cxx11::string::operator[]((ulong)local_88);
          sd_offset_update<sparse_parameters>
                    (in_stack_fffffffffffffd90,(features *)CONCAT44(in_stack_fffffffffffffd8c,fVar6)
                     ,(uint64_t)in_stack_fffffffffffffd80,
                     (float)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                     SUB84(in_stack_fffffffffffffd78,0));
        }
        for (local_a0 = 1; local_a0 <= *(uint *)(local_8 + 5); local_a0 = local_a0 + 1) {
          pfVar3 = v_array<float>::operator[]((v_array<float> *)(local_8 + 1),local_a0 * 2 - 1);
          local_a4 = *pfVar3;
          std::__cxx11::string::operator[]((ulong)local_88);
          sd_offset_update<sparse_parameters>
                    (in_stack_fffffffffffffd90,(features *)CONCAT44(in_stack_fffffffffffffd8c,fVar6)
                     ,(uint64_t)in_stack_fffffffffffffd80,
                     (float)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                     SUB84(in_stack_fffffffffffffd78,0));
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_78);
  }
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(in_stack_fffffffffffffd48);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_fffffffffffffd48);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffd50,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffd48);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_240);
    std::operator<<(&local_230,"cannot use triples in matrix factorization");
    uVar4 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,plineNumber,
               in_stack_fffffffffffffd68);
    __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  return;
}

Assistant:

void mf_train(gdmf& d, example& ec, T& weights)
{
  vw& all = *d.all;
  label_data& ld = ec.l.simple;

  // use final prediction to get update size
  // update = eta_t*(y-y_hat) where eta_t = eta/(3*t^p) * importance weight
  float eta_t = all.eta / powf((float)all.sd->t + ec.weight, (float)all.power_t) / 3.f * ec.weight;
  float update = all.loss->getUpdate(ec.pred.scalar, ld.label, eta_t, 1.);  // ec.total_sum_feat_sq);

  float regularization = eta_t * all.l2_lambda;

  // linear update
  for (features& fs : ec) sd_offset_update<T>(weights, fs, 0, update, regularization);

  // quadratic update
  for (string& i : all.pairs)
  {
    if (ec.feature_space[(int)i[0]].size() > 0 && ec.feature_space[(int)i[1]].size() > 0)
    {
      // update l^k weights
      for (size_t k = 1; k <= d.rank; k++)
      {
        // r^k \cdot x_r
        float r_dot_x = d.scalars[2 * k];
        // l^k <- l^k + update * (r^k \cdot x_r) * x_l
        sd_offset_update<T>(weights, ec.feature_space[(int)i[0]], k, update * r_dot_x, regularization);
      }
      // update r^k weights
      for (size_t k = 1; k <= d.rank; k++)
      {
        // l^k \cdot x_l
        float l_dot_x = d.scalars[2 * k - 1];
        // r^k <- r^k + update * (l^k \cdot x_l) * x_r
        sd_offset_update<T>(weights, ec.feature_space[(int)i[1]], k + d.rank, update * l_dot_x, regularization);
      }
    }
  }
  if (all.triples.begin() != all.triples.end())
    THROW("cannot use triples in matrix factorization");
}